

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O1

void luaC_barrierback_(lua_State *L,GCObject *o)

{
  byte bVar1;
  global_State *pgVar2;
  byte bVar3;
  GCObject **ppGVar4;
  byte bVar5;
  
  bVar1 = o->marked;
  bVar3 = 0xc6;
  if ((bVar1 & 7) != 6) {
    pgVar2 = L->l_G;
    ppGVar4 = getgclist(o);
    *ppGVar4 = pgVar2->grayagain;
    pgVar2->grayagain = o;
    bVar3 = 199;
  }
  bVar5 = bVar1 & 0xc0 | 5;
  if ((bVar1 & 6) == 0) {
    bVar5 = bVar3 & bVar1;
  }
  o->marked = bVar5;
  return;
}

Assistant:

void luaC_barrierback_ (lua_State *L, GCObject *o) {
  global_State *g = G(L);
  lua_assert(isblack(o) && !isdead(g, o));
  lua_assert((g->gckind == KGC_GEN) == (isold(o) && getage(o) != G_TOUCHED1));
  if (getage(o) == G_TOUCHED2)  /* already in gray list? */
    set2gray(o);  /* make it gray to become touched1 */
  else  /* link it in 'grayagain' and paint it gray */
    linkobjgclist(o, g->grayagain);
  if (isold(o))  /* generational mode? */
    setage(o, G_TOUCHED1);  /* touched in current cycle */
}